

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EnumTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EnumTypeSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
          (BumpAllocator *this,Token *args,DataTypeSyntax **args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_5)

{
  Token keyword;
  Token openBrace;
  Token closeBrace;
  EnumTypeSyntax *this_00;
  
  this_00 = (EnumTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EnumTypeSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (EnumTypeSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  openBrace.kind = args_2->kind;
  openBrace._2_1_ = args_2->field_0x2;
  openBrace.numFlags.raw = (args_2->numFlags).raw;
  openBrace.rawLen = args_2->rawLen;
  openBrace.info = args_2->info;
  closeBrace.kind = args_4->kind;
  closeBrace._2_1_ = args_4->field_0x2;
  closeBrace.numFlags.raw = (args_4->numFlags).raw;
  closeBrace.rawLen = args_4->rawLen;
  closeBrace.info = args_4->info;
  slang::syntax::EnumTypeSyntax::EnumTypeSyntax
            (this_00,keyword,*args_1,openBrace,args_3,closeBrace,args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }